

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void emit_destructor_code(FILE *out,symbol *sp,lemon *lemp,int *lineno)

{
  FILE *in_RCX;
  long in_RDX;
  long in_RSI;
  FILE *in_RDI;
  char *cp;
  char *pcVar1;
  
  pcVar1 = (char *)0x0;
  if (*(int *)(in_RSI + 0xc) == 0) {
    pcVar1 = *(char **)(in_RDX + 0xd0);
    if (pcVar1 == (char *)0x0) {
      return;
    }
    fprintf(in_RDI,"{\n");
    in_RCX->_flags = in_RCX->_flags + 1;
  }
  else if (*(long *)(in_RSI + 0x38) == 0) {
    if (*(long *)(in_RDX + 0xd8) != 0) {
      pcVar1 = *(char **)(in_RDX + 0xd8);
      if (pcVar1 == (char *)0x0) {
        return;
      }
      fprintf(in_RDI,"{\n");
      in_RCX->_flags = in_RCX->_flags + 1;
    }
  }
  else {
    pcVar1 = *(char **)(in_RSI + 0x38);
    fprintf(in_RDI,"{\n");
    in_RCX->_flags = in_RCX->_flags + 1;
    if (*(int *)(in_RDX + 0x114) == 0) {
      in_RCX->_flags = in_RCX->_flags + 1;
      tplt_linedir(in_RCX,(int)((ulong)pcVar1 >> 0x20),(char *)0x1106bb);
    }
  }
  for (; *pcVar1 != '\0'; pcVar1 = pcVar1 + 1) {
    if ((*pcVar1 == '$') && (pcVar1[1] == '$')) {
      fprintf(in_RDI,"(yypminor->yy%d)",(ulong)*(uint *)(in_RSI + 0x50));
      pcVar1 = pcVar1 + 1;
    }
    else {
      if (*pcVar1 == '\n') {
        in_RCX->_flags = in_RCX->_flags + 1;
      }
      fputc((int)*pcVar1,in_RDI);
    }
  }
  fprintf(in_RDI,"\n");
  in_RCX->_flags = in_RCX->_flags + 1;
  if (*(int *)(in_RDX + 0x114) == 0) {
    in_RCX->_flags = in_RCX->_flags + 1;
    tplt_linedir(in_RCX,(int)((ulong)pcVar1 >> 0x20),(char *)0x1107ec);
  }
  fprintf(in_RDI,"}\n");
  in_RCX->_flags = in_RCX->_flags + 1;
  return;
}

Assistant:

void emit_destructor_code(
  FILE *out,
  struct symbol *sp,
  struct lemon *lemp,
  int *lineno
){
 char *cp = 0;

 if( sp->type==TERMINAL ){
   cp = lemp->tokendest;
   if( cp==0 ) return;
   fprintf(out,"{\n"); (*lineno)++;
 }else if( sp->destructor ){
   cp = sp->destructor;
   fprintf(out,"{\n"); (*lineno)++;
   if( !lemp->nolinenosflag ){
     (*lineno)++;
     tplt_linedir(out,sp->destLineno,lemp->filename);
   }
 }else if( lemp->vardest ){
   cp = lemp->vardest;
   if( cp==0 ) return;
   fprintf(out,"{\n"); (*lineno)++;
 }else{
   assert( 0 );  /* Cannot happen */
 }
 for(; *cp; cp++){
   if( *cp=='$' && cp[1]=='$' ){
     fprintf(out,"(yypminor->yy%d)",sp->dtnum);
     cp++;
     continue;
   }
   if( *cp=='\n' ) (*lineno)++;
   fputc(*cp,out);
 }
 fprintf(out,"\n"); (*lineno)++;
 if (!lemp->nolinenosflag) {
   (*lineno)++; tplt_linedir(out,*lineno,lemp->outname);
 }
 fprintf(out,"}\n"); (*lineno)++;
 return;
}